

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

char * fmt::v11::detail::parse_format_specs<char>
                 (char *begin,char *end,dynamic_format_specs<char> *specs,parse_context<char> *ctx,
                 type arg_type)

{
  basic_string_view<char> s;
  bool bVar1;
  char c_00;
  align aVar2;
  int iVar3;
  char *pcVar4;
  make_unsigned_t<long> count;
  arg_ref<char> *in_RDX;
  sign s_00;
  anon_struct_24_3_3d55a02b *in_RSI;
  anon_struct_24_3_3d55a02b *in_RDI;
  type in_R8D;
  align alignment;
  char *fill_end;
  anon_struct_24_3_3d55a02b parse_presentation_type;
  int integral_set;
  anon_struct_4_1_8b22846b enter_state;
  char next;
  char c;
  int in_stack_ffffffffffffff58;
  state in_stack_ffffffffffffff5c;
  pres pres_type;
  anon_struct_24_3_3d55a02b *in_stack_ffffffffffffff60;
  arg_ref<char> *in_stack_ffffffffffffff68;
  anon_struct_24_3_3d55a02b *in_stack_ffffffffffffff70;
  arg_ref<char> *in_stack_ffffffffffffff78;
  char local_71;
  basic_string_view<char> local_70;
  align local_5c;
  char *local_58;
  anon_struct_24_3_3d55a02b **local_50;
  arg_ref<char> *local_48;
  type local_40;
  undefined4 local_38;
  _unnamed_type_1_ local_34 [6];
  char local_2e;
  char local_2d;
  type local_2c;
  arg_ref<char> *local_20;
  anon_struct_24_3_3d55a02b *local_18;
  anon_struct_24_3_3d55a02b *local_10 [2];
  
  local_2d = 0;
  local_2c = in_R8D;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10[0] = in_RDI;
  if ((long)in_RSI - (long)in_RDI < 2) {
    if (in_RDI == in_RSI) {
      return (char *)in_RDI;
    }
    local_2d = to_ascii<char,_0>(*(char *)&in_RDI->begin);
  }
  else {
    local_2e = to_ascii<char,_0>(*(char *)((long)&in_RDI->begin + 1));
    aVar2 = parse_align(local_2e);
    if (aVar2 == none) {
      local_71 = to_ascii<char,_0>(*(char *)&local_10[0]->begin);
    }
    else {
      local_71 = '\0';
    }
    local_2d = local_71;
  }
  parse_format_specs<char>(char_const*,char_const*,fmt::v11::detail::dynamic_format_specs<char>&,fmt::v11::parse_context<char>&,fmt::v11::detail::type)
  ::{unnamed_type#1}::type(local_34);
  local_38 = 0x1fe;
  local_50 = local_10;
  local_48 = local_20;
  local_40 = local_2c;
  do {
    pcVar4 = (char *)(ulong)((int)local_2d - 0x20);
    bVar1 = SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0);
    pres_type = (pres)(in_stack_ffffffffffffff5c >> 0x18);
    switch(pcVar4) {
    case (char *)0x0:
    case (char *)0xb:
      s_00 = plus;
      if (local_2d == ' ') {
        s_00 = space;
      }
      basic_specs::set_sign((basic_specs *)&local_20->name,s_00);
    case (char *)0xd:
      in(local_2c,0xe2a);
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                ((anon_struct_4_1_8b22846b *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
      local_10[0] = (anon_struct_24_3_3d55a02b *)((long)&local_10[0]->begin + 1);
      break;
    default:
      if (*(char *)&local_10[0]->begin == '}') {
        return (char *)local_10[0];
      }
      in_stack_ffffffffffffff70 = local_10[0];
      iVar3 = code_point_length<char>((char *)local_10[0]);
      local_58 = (char *)((long)&in_stack_ffffffffffffff70->begin + (long)iVar3);
      if ((long)local_18 - (long)local_58 < 1) {
        report_error((char *)in_stack_ffffffffffffff70);
      }
      if (*(char *)&local_10[0]->begin == '{') {
        report_error((char *)in_stack_ffffffffffffff70);
      }
      c_00 = to_ascii<char,_0>(*local_58);
      local_5c = parse_align(c_00);
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                ((anon_struct_4_1_8b22846b *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
      in_stack_ffffffffffffff60 = local_10[0];
      in_stack_ffffffffffffff68 = local_20;
      count = to_unsigned<long>((long)local_10[0]);
      basic_string_view<char>::basic_string_view(&local_70,(char *)in_stack_ffffffffffffff60,count);
      s.size_ = (size_t)pcVar4;
      s.data_ = (char *)in_stack_ffffffffffffff78;
      basic_specs::set_fill<char>((basic_specs *)in_stack_ffffffffffffff70,s);
      basic_specs::set_align((basic_specs *)&local_20->name,local_5c);
      local_10[0] = (anon_struct_24_3_3d55a02b *)(local_58 + 1);
      break;
    case (char *)0x3:
      is_arithmetic_type(local_2c);
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                ((anon_struct_4_1_8b22846b *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
      basic_specs::set_alt((basic_specs *)&local_20->name);
      local_10[0] = (anon_struct_24_3_3d55a02b *)((long)&local_10[0]->begin + 1);
      break;
    case (char *)0xe:
      in(local_2c,0x3e00);
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                ((anon_struct_4_1_8b22846b *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
      local_10[0] = (anon_struct_24_3_3d55a02b *)
                    parse_precision<char>
                              (pcVar4,(char *)&in_stack_ffffffffffffff78->index,
                               (format_specs *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                               (parse_context<char> *)in_stack_ffffffffffffff60);
      break;
    case (char *)0x10:
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                ((anon_struct_4_1_8b22846b *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 bVar1);
      bVar1 = is_arithmetic_type(local_2c);
      if (!bVar1) {
        report_error((char *)in_stack_ffffffffffffff70);
      }
      aVar2 = basic_specs::align((basic_specs *)&local_20->name);
      if (aVar2 == none) {
        basic_specs::set_align((basic_specs *)&local_20->name,numeric);
        basic_specs::set_fill
                  ((basic_specs *)in_stack_ffffffffffffff60,
                   (char)(in_stack_ffffffffffffff5c >> 0x18));
      }
      local_10[0] = (anon_struct_24_3_3d55a02b *)((long)&local_10[0]->begin + 1);
      break;
    case (char *)0x11:
    case (char *)0x12:
    case (char *)0x13:
    case (char *)0x14:
    case (char *)0x15:
    case (char *)0x16:
    case (char *)0x17:
    case (char *)0x18:
    case (char *)0x19:
    case (char *)0x5b:
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                ((anon_struct_4_1_8b22846b *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 bVar1);
      local_10[0] = (anon_struct_24_3_3d55a02b *)
                    parse_width<char>(pcVar4,(char *)&in_stack_ffffffffffffff78->index,
                                      (format_specs *)in_stack_ffffffffffffff70,
                                      in_stack_ffffffffffffff68,
                                      (parse_context<char> *)in_stack_ffffffffffffff60);
      break;
    case (char *)0x1c:
    case (char *)0x1e:
    case (char *)0x3e:
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                ((anon_struct_4_1_8b22846b *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 bVar1);
      in_stack_ffffffffffffff78 = local_20;
      aVar2 = parse_align(local_2d);
      basic_specs::set_align((basic_specs *)&in_stack_ffffffffffffff78->name,aVar2);
      local_10[0] = (anon_struct_24_3_3d55a02b *)((long)&local_10[0]->begin + 1);
      break;
    case (char *)0x1f:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,pres_type,in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x21:
      basic_specs::set_upper((basic_specs *)&local_20->name);
    case (char *)0x41:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,(pres)(in_stack_ffffffffffffff5c >> 0x18),
                          in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x22:
      basic_specs::set_upper((basic_specs *)&local_20->name);
    case (char *)0x42:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,(pres)(in_stack_ffffffffffffff5c >> 0x18),
                          in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x25:
      basic_specs::set_upper((basic_specs *)&local_20->name);
    case (char *)0x45:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,(pres)(in_stack_ffffffffffffff5c >> 0x18),
                          in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x26:
      basic_specs::set_upper((basic_specs *)&local_20->name);
    case (char *)0x46:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,(pres)(in_stack_ffffffffffffff5c >> 0x18),
                          in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x27:
      basic_specs::set_upper((basic_specs *)&local_20->name);
    case (char *)0x47:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,(pres)(in_stack_ffffffffffffff5c >> 0x18),
                          in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x2c:
      is_arithmetic_type(local_2c);
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                ((anon_struct_4_1_8b22846b *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
      basic_specs::set_localized((basic_specs *)&local_20->name);
      local_10[0] = (anon_struct_24_3_3d55a02b *)((long)&local_10[0]->begin + 1);
      break;
    case (char *)0x38:
      basic_specs::set_upper((basic_specs *)&local_20->name);
    case (char *)0x58:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,(pres)(in_stack_ffffffffffffff5c >> 0x18),
                          in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x43:
      if (local_2c != bool_type) {
        pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                           (in_stack_ffffffffffffff60,pres_type,in_stack_ffffffffffffff58);
        return pcVar4;
      }
      report_error((char *)in_stack_ffffffffffffff70);
    case (char *)0x44:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,pres_type,in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x4f:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,pres_type,in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x50:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,pres_type,in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x53:
      pcVar4 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (in_stack_ffffffffffffff60,pres_type,in_stack_ffffffffffffff58);
      return pcVar4;
    case (char *)0x5d:
      return (char *)local_10[0];
    }
    if (local_10[0] == local_18) {
      return (char *)local_10[0];
    }
    local_2d = to_ascii<char,_0>(*(char *)&local_10[0]->begin);
  } while( true );
}

Assistant:

FMT_CONSTEXPR auto parse_format_specs(const Char* begin, const Char* end,
                                      dynamic_format_specs<Char>& specs,
                                      parse_context<Char>& ctx, type arg_type)
    -> const Char* {
  auto c = '\0';
  if (end - begin > 1) {
    auto next = to_ascii(begin[1]);
    c = parse_align(next) == align::none ? to_ascii(*begin) : '\0';
  } else {
    if (begin == end) return begin;
    c = to_ascii(*begin);
  }

  struct {
    state current_state = state::start;
    FMT_CONSTEXPR void operator()(state s, bool valid = true) {
      if (current_state >= s || !valid)
        report_error("invalid format specifier");
      current_state = s;
    }
  } enter_state;

  using pres = presentation_type;
  constexpr auto integral_set = sint_set | uint_set | bool_set | char_set;
  struct {
    const Char*& begin;
    format_specs& specs;
    type arg_type;

    FMT_CONSTEXPR auto operator()(pres pres_type, int set) -> const Char* {
      if (!in(arg_type, set)) report_error("invalid format specifier");
      specs.set_type(pres_type);
      return begin + 1;
    }
  } parse_presentation_type{begin, specs, arg_type};

  for (;;) {
    switch (c) {
    case '<':
    case '>':
    case '^':
      enter_state(state::align);
      specs.set_align(parse_align(c));
      ++begin;
      break;
    case '+':
    case ' ':
      specs.set_sign(c == ' ' ? sign::space : sign::plus);
      FMT_FALLTHROUGH;
    case '-':
      enter_state(state::sign, in(arg_type, sint_set | float_set));
      ++begin;
      break;
    case '#':
      enter_state(state::hash, is_arithmetic_type(arg_type));
      specs.set_alt();
      ++begin;
      break;
    case '0':
      enter_state(state::zero);
      if (!is_arithmetic_type(arg_type))
        report_error("format specifier requires numeric argument");
      if (specs.align() == align::none) {
        // Ignore 0 if align is specified for compatibility with std::format.
        specs.set_align(align::numeric);
        specs.set_fill('0');
      }
      ++begin;
      break;
      // clang-format off
    case '1': case '2': case '3': case '4': case '5':
    case '6': case '7': case '8': case '9': case '{':
      // clang-format on
      enter_state(state::width);
      begin = parse_width(begin, end, specs, specs.width_ref, ctx);
      break;
    case '.':
      enter_state(state::precision,
                  in(arg_type, float_set | string_set | cstring_set));
      begin = parse_precision(begin, end, specs, specs.precision_ref, ctx);
      break;
    case 'L':
      enter_state(state::locale, is_arithmetic_type(arg_type));
      specs.set_localized();
      ++begin;
      break;
    case 'd': return parse_presentation_type(pres::dec, integral_set);
    case 'X': specs.set_upper(); FMT_FALLTHROUGH;
    case 'x': return parse_presentation_type(pres::hex, integral_set);
    case 'o': return parse_presentation_type(pres::oct, integral_set);
    case 'B': specs.set_upper(); FMT_FALLTHROUGH;
    case 'b': return parse_presentation_type(pres::bin, integral_set);
    case 'E': specs.set_upper(); FMT_FALLTHROUGH;
    case 'e': return parse_presentation_type(pres::exp, float_set);
    case 'F': specs.set_upper(); FMT_FALLTHROUGH;
    case 'f': return parse_presentation_type(pres::fixed, float_set);
    case 'G': specs.set_upper(); FMT_FALLTHROUGH;
    case 'g': return parse_presentation_type(pres::general, float_set);
    case 'A': specs.set_upper(); FMT_FALLTHROUGH;
    case 'a': return parse_presentation_type(pres::hexfloat, float_set);
    case 'c':
      if (arg_type == type::bool_type) report_error("invalid format specifier");
      return parse_presentation_type(pres::chr, integral_set);
    case 's':
      return parse_presentation_type(pres::string,
                                     bool_set | string_set | cstring_set);
    case 'p':
      return parse_presentation_type(pres::pointer, pointer_set | cstring_set);
    case '?':
      return parse_presentation_type(pres::debug,
                                     char_set | string_set | cstring_set);
    case '}': return begin;
    default:  {
      if (*begin == '}') return begin;
      // Parse fill and alignment.
      auto fill_end = begin + code_point_length(begin);
      if (end - fill_end <= 0) {
        report_error("invalid format specifier");
        return begin;
      }
      if (*begin == '{') {
        report_error("invalid fill character '{'");
        return begin;
      }
      auto alignment = parse_align(to_ascii(*fill_end));
      enter_state(state::align, alignment != align::none);
      specs.set_fill(
          basic_string_view<Char>(begin, to_unsigned(fill_end - begin)));
      specs.set_align(alignment);
      begin = fill_end + 1;
    }
    }
    if (begin == end) return begin;
    c = to_ascii(*begin);
  }
}